

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitileave.hpp
# Opt level: O0

uint64_t bitmanip::detail::remIleavedBits_shift<12u>(uint64_t input)

{
  ulong uStack_58;
  uint rshift;
  size_t i;
  size_t iterations;
  uint64_t MASKS [6];
  ulong local_10;
  uint64_t input_local;
  
  memset(&iterations,0,0x30);
  MASKS[0] = 0x3000000c000003;
  MASKS[1] = 0xf000000000000f;
  MASKS[2] = 0xff;
  local_10 = input & 0x10008004002001;
  for (uStack_58 = 0; uStack_58 < 3; uStack_58 = uStack_58 + 1) {
    local_10 = MASKS[uStack_58] &
               (local_10 >> ((char)(1 << ((byte)uStack_58 & 0x1f)) * '\f' & 0x3fU) | local_10);
  }
  return local_10;
}

Assistant:

[[nodiscard]] constexpr std::uint64_t remIleavedBits_shift(std::uint64_t input) noexcept
{
    if constexpr (BITS == 0) {
        return input;
    }
    else {
        constexpr std::uint64_t MASKS[] = {
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 1),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 2),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 4),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 8),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 16),
            detail::duplBits_naive(detail::ileaveZeros_naive(~std::uint32_t(0), BITS), 32),
        };
        // log2_floor(0) == 0 so this is always safe, even for 1 bit
        constexpr std::size_t iterations = 5 - bitmanip::log2floor(BITS >> 1);

        input &= MASKS[0];

        for (std::size_t i = 0; i < iterations; ++i) {
            unsigned rshift = (1u << i) * BITS;
            input |= input >> rshift;
            input &= MASKS[i + 1];
        }

        return input;
    }
}